

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O3

FT_Error PCF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  short sVar1;
  undefined4 uVar2;
  FT_Face pFVar3;
  FT_Stream stream;
  short sVar4;
  short sVar5;
  short sVar6;
  uint uVar7;
  FT_Error FVar8;
  ushort *puVar9;
  uchar *puVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  FT_Bitmap_Size *pFVar15;
  ulong uVar16;
  long lVar17;
  FT_Error FVar18;
  int iVar19;
  undefined1 auVar20 [16];
  
  pFVar3 = size->face;
  if (pFVar3 == (FT_Face)0x0) {
    FVar8 = 0x23;
  }
  else {
    FVar8 = 6;
    if (glyph_index < (uint)pFVar3->num_glyphs) {
      stream = pFVar3->stream;
      uVar7 = glyph_index - 1;
      if (glyph_index == 0) {
        uVar7 = 0;
      }
      uVar16 = (ulong)uVar7;
      lVar14 = pFVar3[2].num_glyphs;
      iVar19 = (int)*(short *)(lVar14 + 6 + uVar16 * 0x18);
      uVar7 = *(short *)(lVar14 + 8 + uVar16 * 0x18) + iVar19;
      (slot->bitmap).rows = uVar7;
      iVar12 = (int)*(short *)(lVar14 + uVar16 * 0x18);
      lVar17 = (long)*(short *)(lVar14 + 2 + uVar16 * 0x18) - (long)iVar12;
      uVar13 = (uint)lVar17;
      (slot->bitmap).width = uVar13;
      (slot->bitmap).num_grays = 1;
      (slot->bitmap).pixel_mode = '\x01';
      bVar11 = *(byte *)&pFVar3[2].available_sizes & 3;
      FVar8 = 3;
      if ((1 << bVar11) - 1U < 8) {
        switch(bVar11) {
        case 0:
          uVar13 = uVar13 + 7 >> 3;
          break;
        case 1:
          uVar13 = uVar13 + 0xf >> 3 & 0xfffffffe;
          break;
        case 2:
          uVar13 = uVar13 + 0x1f >> 3 & 0xfffffffc;
          break;
        case 3:
          uVar13 = uVar13 + 0x3f >> 3 & 0xfffffff8;
        }
        lVar14 = lVar14 + uVar16 * 0x18;
        (slot->bitmap).pitch = uVar13;
        slot->format = FT_GLYPH_FORMAT_BITMAP;
        slot->bitmap_left = iVar12;
        slot->bitmap_top = iVar19;
        sVar1 = *(short *)(lVar14 + 4);
        (slot->metrics).horiBearingX = (long)iVar12 << 6;
        iVar12 = (int)sVar1 << 6;
        (slot->metrics).horiBearingY = CONCAT44(-(uint)(iVar19 << 6 < 0),iVar19 << 6);
        *(int *)&(slot->metrics).vertBearingX = iVar12;
        *(uint *)((long)&(slot->metrics).vertBearingX + 4) = -(uint)(iVar12 < 0);
        (slot->metrics).width = lVar17 * 0x40;
        (slot->metrics).height = (ulong)(uVar7 * 0x40);
        ft_synthesize_vertical_metrics
                  (&slot->metrics,
                   (*(long *)&pFVar3[1].max_advance_width + *(long *)&pFVar3[1].units_per_EM) * 0x40
                  );
        FVar18 = 0;
        FVar8 = 0;
        if (((uint)load_flags >> 0x16 & 1) == 0) {
          uVar16 = (ulong)(slot->bitmap).rows * (long)(slot->bitmap).pitch;
          FVar8 = ft_glyphslot_alloc_bitmap(slot,uVar16);
          if (((FVar8 == 0) &&
              (FVar8 = FT_Stream_Seek(stream,*(FT_ULong *)(lVar14 + 0x10)), FVar8 == 0)) &&
             (FVar8 = FT_Stream_Read(stream,(slot->bitmap).buffer,uVar16), FVar8 == 0)) {
            pFVar15 = pFVar3[2].available_sizes;
            if (uVar16 != 0 && (char)(((uint)pFVar15 & 8) >> 3) == '\0') {
              puVar10 = (slot->bitmap).buffer;
              lVar14 = 0;
              do {
                bVar11 = puVar10[lVar14];
                bVar11 = bVar11 << 4 | bVar11 >> 4;
                bVar11 = bVar11 >> 2 & 0x33 | (bVar11 & 0x33) << 2;
                puVar10[lVar14] = bVar11 >> 1 & 0x55 | (bVar11 & 0x55) * '\x02';
                lVar14 = lVar14 + 1;
              } while (uVar16 - lVar14 != 0);
              pFVar15 = pFVar3[2].available_sizes;
            }
            FVar8 = 0;
            if ((((uint)((ulong)pFVar15 >> 3) & 0x1fffffff ^
                 (uint)((ulong)pFVar15 >> 2) & 0x3fffffff) & 1) != 0) {
              iVar12 = 1 << ((byte)((ulong)pFVar15 >> 4) & 3);
              FVar8 = FVar18;
              if (iVar12 == 4) {
                if (3 < uVar16) {
                  puVar10 = (slot->bitmap).buffer;
                  do {
                    uVar2 = *(undefined4 *)puVar10;
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ =
                         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)(byte)((uint)uVar2 >> 0x18) << 0x30) >> 0x28
                                                  ),CONCAT14((char)((uint)uVar2 >> 0x10),uVar2)) >>
                                                  0x20),uVar2) >> 0x18),
                                                  CONCAT12((char)((uint)uVar2 >> 8),(short)uVar2))
                                               >> 0x10),(short)uVar2) & 0xffff00ff00ff00ff;
                    auVar20 = pshuflw(auVar20,auVar20,0x1b);
                    sVar1 = auVar20._0_2_;
                    sVar4 = auVar20._2_2_;
                    sVar5 = auVar20._4_2_;
                    sVar6 = auVar20._6_2_;
                    *(uint *)puVar10 =
                         CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar20[6] - (0xff < sVar6),
                                  CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar20[4] -
                                           (0xff < sVar5),
                                           CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar20[2] -
                                                    (0xff < sVar4),
                                                    (0 < sVar1) * (sVar1 < 0x100) * auVar20[0] -
                                                    (0xff < sVar1))));
                    uVar16 = uVar16 - 4;
                    puVar10 = puVar10 + 4;
                  } while (3 < uVar16);
                }
              }
              else if ((iVar12 == 2) && (1 < uVar16)) {
                puVar9 = (ushort *)(slot->bitmap).buffer;
                do {
                  *puVar9 = *puVar9 << 8 | *puVar9 >> 8;
                  uVar16 = uVar16 - 2;
                  puVar9 = puVar9 + 1;
                } while (1 < uVar16);
              }
            }
          }
        }
      }
    }
  }
  return FVar8;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    PCF_Face    face   = (PCF_Face)FT_SIZE_FACE( size );
    FT_Stream   stream;
    FT_Error    error  = FT_Err_Ok;
    FT_Bitmap*  bitmap = &slot->bitmap;
    PCF_Metric  metric;
    FT_ULong    bytes;


    FT_TRACE1(( "PCF_Glyph_Load: glyph index %d\n", glyph_index ));

    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    stream = face->root.stream;

    if ( glyph_index > 0 )
      glyph_index--;

    metric = face->metrics + glyph_index;

    bitmap->rows       = (unsigned int)( metric->ascent +
                                         metric->descent );
    bitmap->width      = (unsigned int)( metric->rightSideBearing -
                                         metric->leftSideBearing );
    bitmap->num_grays  = 1;
    bitmap->pixel_mode = FT_PIXEL_MODE_MONO;

    switch ( PCF_GLYPH_PAD( face->bitmapsFormat ) )
    {
    case 1:
      bitmap->pitch = (int)( ( bitmap->width + 7 ) >> 3 );
      break;

    case 2:
      bitmap->pitch = (int)( ( ( bitmap->width + 15 ) >> 4 ) << 1 );
      break;

    case 4:
      bitmap->pitch = (int)( ( ( bitmap->width + 31 ) >> 5 ) << 2 );
      break;

    case 8:
      bitmap->pitch = (int)( ( ( bitmap->width + 63 ) >> 6 ) << 3 );
      break;

    default:
      return FT_THROW( Invalid_File_Format );
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = metric->leftSideBearing;
    slot->bitmap_top  = metric->ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( metric->characterWidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( metric->leftSideBearing * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( metric->ascent * 64 );
    slot->metrics.width        = (FT_Pos)( ( metric->rightSideBearing -
                                             metric->leftSideBearing ) * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    ft_synthesize_vertical_metrics( &slot->metrics,
                                    ( face->accel.fontAscent +
                                      face->accel.fontDescent ) * 64 );

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      goto Exit;

    /* XXX: to do: are there cases that need repadding the bitmap? */
    bytes = (FT_ULong)bitmap->pitch * bitmap->rows;

    error = ft_glyphslot_alloc_bitmap( slot, (FT_ULong)bytes );
    if ( error )
      goto Exit;

    if ( FT_STREAM_SEEK( metric->bits )          ||
         FT_STREAM_READ( bitmap->buffer, bytes ) )
      goto Exit;

    if ( PCF_BIT_ORDER( face->bitmapsFormat ) != MSBFirst )
      BitOrderInvert( bitmap->buffer, bytes );

    if ( ( PCF_BYTE_ORDER( face->bitmapsFormat ) !=
           PCF_BIT_ORDER( face->bitmapsFormat )  ) )
    {
      switch ( PCF_SCAN_UNIT( face->bitmapsFormat ) )
      {
      case 1:
        break;

      case 2:
        TwoByteSwap( bitmap->buffer, bytes );
        break;

      case 4:
        FourByteSwap( bitmap->buffer, bytes );
        break;
      }
    }

  Exit:
    return error;
  }